

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilFile.c
# Opt level: O2

void Extra_PrintHex(FILE *pFile,uint *pTruth,int nVars)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  fwrite("0x",2,1,(FILE *)pFile);
  uVar3 = 1 << ((byte)nVars & 0x1f);
  uVar3 = (uint)(0 < (int)(uVar3 & 0x80000003)) + (int)uVar3 / 4;
  iVar1 = uVar3 * 4;
  while (iVar1 = iVar1 + -4, 0 < (int)uVar3) {
    uVar3 = uVar3 - 1;
    uVar2 = pTruth[uVar3 >> 3] >> ((byte)iVar1 & 0x1f) & 0xf;
    if (uVar2 < 10) {
      fprintf((FILE *)pFile,"%d");
    }
    else {
      fputc(uVar2 + 0x37,(FILE *)pFile);
    }
  }
  return;
}

Assistant:

void Extra_PrintHex( FILE * pFile, unsigned * pTruth, int nVars )
{
    int nMints, nDigits, Digit, k;

    // write the number into the file
    fprintf( pFile, "0x" );
    nMints  = (1 << nVars);
    nDigits = nMints / 4 + ((nMints % 4) > 0);
    for ( k = nDigits - 1; k >= 0; k-- )
    {
        Digit = ((pTruth[k/8] >> (k * 4)) & 15);
        if ( Digit < 10 )
            fprintf( pFile, "%d", Digit );
        else
            fprintf( pFile, "%c", 'A' + Digit-10 );
    }
//    fprintf( pFile, "\n" );
}